

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O2

Response execute_command(IndexFromCommand *cmd,Task *task,DatabaseSnapshot *snap)

{
  pointer *taints;
  IndexFromCommand *pIVar1;
  runtime_error *this;
  DatabaseSnapshot *in_RCX;
  json_value extraout_RDX;
  Response RVar2;
  IndexFromCommand *local_288;
  DatabaseSnapshot *local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string filename;
  ifstream inf;
  byte abStack_218 [488];
  
  paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&inf,(string *)task,_S_bin);
  if ((abStack_218[*(long *)(_inf + -0x18)] & 5) == 0) {
    local_280 = in_RCX;
    std::ios::exceptions((int)&local_288 + (int)*(long *)(_inf + -0x18) + 0x50);
    local_288 = cmd;
    while ((abStack_218[*(long *)(_inf + -0x18)] & 2) == 0) {
      filename._M_string_length = 0;
      filename.field_2._M_local_buf[0] = '\0';
      filename._M_dataplus._M_p = (pointer)&filename.field_2;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&inf,(string *)&filename);
      if (filename._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&paths,&filename);
      }
      std::__cxx11::string::~string((string *)&filename);
    }
    taints = &task[1].changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if (*(char *)&task[3].changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
                  super__Vector_impl_data._M_start == '\x01') {
      DatabaseSnapshot::recursive_index_paths
                (local_280,(Task *)snap,(vector<IndexType,_std::allocator<IndexType>_> *)(task + 1),
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)taints,&paths);
    }
    else {
      DatabaseSnapshot::force_recursive_index_paths
                (local_280,(Task *)snap,(vector<IndexType,_std::allocator<IndexType>_> *)(task + 1),
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)taints,&paths);
    }
    pIVar1 = local_288;
    Response::ok();
    std::ifstream::~ifstream(&inf);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&paths);
    RVar2.content.m_value.object = extraout_RDX.object;
    RVar2.content._0_8_ = pIVar1;
    return (Response)RVar2.content;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"failed to open file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Response execute_command(const IndexFromCommand &cmd, Task *task,
                         const DatabaseSnapshot *snap) {
    const auto &path_list_fname = cmd.get_path_list_fname();

    std::vector<std::string> paths;
    std::ifstream inf(path_list_fname, std::ifstream::binary);

    if (!inf) {
        throw std::runtime_error("failed to open file");
    }

    inf.exceptions(std::ifstream::badbit);

    while (!inf.eof()) {
        std::string filename;
        std::getline(inf, filename);

        if (!filename.empty()) {
            paths.push_back(filename);
        }
    }

    if (cmd.ensure_unique()) {
        snap->recursive_index_paths(task, cmd.get_index_types(), cmd.taints(),
                                    paths);
    } else {
        snap->force_recursive_index_paths(task, cmd.get_index_types(),
                                          cmd.taints(), paths);
    }

    return Response::ok();
}